

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_functions.cpp
# Opt level: O3

void duckdb::RegisterEnableProfiling(BuiltinFunctions *set)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  vector<duckdb::PragmaFunction,_true> *this;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  vector<duckdb::PragmaFunction,_true> *pvVar3;
  PragmaFunctionSet functions;
  string local_228;
  PragmaFunctionSet local_208;
  PragmaFunctionSet local_1d0;
  PragmaFunctionSet local_198;
  string local_160;
  PragmaFunction local_140;
  
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,anon_var_dwarf_6372561 + 9)
  ;
  PragmaFunctionSet::PragmaFunctionSet(&local_208,&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  paVar1 = &local_228.field_2;
  local_228._M_string_length = 0;
  local_228.field_2._M_local_buf[0] = '\0';
  local_228._M_dataplus._M_p = (pointer)paVar1;
  PragmaFunction::PragmaStatement(&local_140,&local_228,PragmaEnableProfilingStatement);
  this = &local_208.super_FunctionSet<duckdb::PragmaFunction>.functions;
  ::std::vector<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>::
  emplace_back<duckdb::PragmaFunction>
            (&this->super_vector<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>,
             &local_140);
  local_140.super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__PragmaFunction_02435b40;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_140.named_parameters._M_h);
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            (&local_140.super_SimpleNamedParameterFunction);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != paVar1) {
    operator_delete(local_228._M_dataplus._M_p);
  }
  local_228._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"enable_profile","");
  paVar2 = &local_198.super_FunctionSet<duckdb::PragmaFunction>.name.field_2;
  local_198.super_FunctionSet<duckdb::PragmaFunction>.name._M_dataplus._M_p = (pointer)paVar2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_198,
             local_208.super_FunctionSet<duckdb::PragmaFunction>.name._M_dataplus._M_p,
             local_208.super_FunctionSet<duckdb::PragmaFunction>.name._M_dataplus._M_p +
             local_208.super_FunctionSet<duckdb::PragmaFunction>.name._M_string_length);
  pvVar3 = &local_198.super_FunctionSet<duckdb::PragmaFunction>.functions;
  ::std::vector<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>::vector
            (&pvVar3->super_vector<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>,
             &this->super_vector<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>);
  BuiltinFunctions::AddFunction(set,&local_228,&local_198);
  ::std::vector<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>::~vector
            (&pvVar3->super_vector<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198.super_FunctionSet<duckdb::PragmaFunction>.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_198.super_FunctionSet<duckdb::PragmaFunction>.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != paVar1) {
    operator_delete(local_228._M_dataplus._M_p);
  }
  local_228._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"enable_profiling","");
  paVar2 = &local_1d0.super_FunctionSet<duckdb::PragmaFunction>.name.field_2;
  local_1d0.super_FunctionSet<duckdb::PragmaFunction>.name._M_dataplus._M_p = (pointer)paVar2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d0,
             local_208.super_FunctionSet<duckdb::PragmaFunction>.name._M_dataplus._M_p,
             local_208.super_FunctionSet<duckdb::PragmaFunction>.name._M_dataplus._M_p +
             local_208.super_FunctionSet<duckdb::PragmaFunction>.name._M_string_length);
  pvVar3 = &local_1d0.super_FunctionSet<duckdb::PragmaFunction>.functions;
  ::std::vector<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>::vector
            (&pvVar3->super_vector<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>,
             &this->super_vector<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>);
  BuiltinFunctions::AddFunction(set,&local_228,&local_1d0);
  ::std::vector<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>::~vector
            (&pvVar3->super_vector<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0.super_FunctionSet<duckdb::PragmaFunction>.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_1d0.super_FunctionSet<duckdb::PragmaFunction>.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != paVar1) {
    operator_delete(local_228._M_dataplus._M_p);
  }
  ::std::vector<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>::~vector
            (&this->super_vector<duckdb::PragmaFunction,_std::allocator<duckdb::PragmaFunction>_>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.super_FunctionSet<duckdb::PragmaFunction>.name._M_dataplus._M_p !=
      &local_208.super_FunctionSet<duckdb::PragmaFunction>.name.field_2) {
    operator_delete(local_208.super_FunctionSet<duckdb::PragmaFunction>.name._M_dataplus._M_p);
  }
  return;
}

Assistant:

void RegisterEnableProfiling(BuiltinFunctions &set) {
	PragmaFunctionSet functions("");
	functions.AddFunction(PragmaFunction::PragmaStatement(string(), PragmaEnableProfilingStatement));

	set.AddFunction("enable_profile", functions);
	set.AddFunction("enable_profiling", functions);
}